

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

void embree::avx::SphereMiIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Geometry *pGVar4;
  __int_type_conflict _Var5;
  undefined1 auVar6 [32];
  uint uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  RayHitK<4> *pRVar10;
  undefined1 (*pauVar12) [16];
  long lVar13;
  Scene *pSVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar24;
  float fVar25;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  HitK<4> h;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 (*local_260) [16];
  undefined1 *local_258;
  void *local_250;
  RTCRayQueryContext *local_248;
  RayHitK<4> *local_240;
  undefined1 (*local_238) [16];
  undefined4 local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  Scene *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [32];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [32];
  ulong uVar11;
  undefined1 auVar38 [64];
  undefined1 auVar40 [64];
  undefined1 auVar44 [64];
  
  pSVar14 = context->scene;
  pGVar4 = (pSVar14->geometries).items[sphere->sharedGeomID].ptr;
  lVar13 = *(long *)&pGVar4->field_0x58;
  _Var5 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar20 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[0] * _Var5);
  auVar17 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[1] * _Var5);
  auVar41 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[2] * _Var5);
  auVar43 = *(undefined1 (*) [16])(lVar13 + (sphere->primIDs).field_0.i[3] * _Var5);
  auVar27 = vunpcklps_avx(auVar20,auVar41);
  auVar20 = vunpckhps_avx(auVar20,auVar41);
  auVar41 = vunpcklps_avx(auVar17,auVar43);
  auVar17 = vunpckhps_avx(auVar17,auVar43);
  auVar43 = vunpcklps_avx(auVar27,auVar41);
  auVar41 = vunpckhps_avx(auVar27,auVar41);
  auVar16 = vunpcklps_avx(auVar20,auVar17);
  auVar29 = vunpckhps_avx(auVar20,auVar17);
  auVar20 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar17 = vpcmpgtd_avx(auVar20,_DAT_01f7fcf0);
  local_f8 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar9 = *(undefined4 *)(ray + k * 4);
  auVar36._4_4_ = uVar9;
  auVar36._0_4_ = uVar9;
  auVar36._8_4_ = uVar9;
  auVar36._12_4_ = uVar9;
  auVar43 = vsubps_avx(auVar43,auVar36);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar27._4_4_ = uVar9;
  auVar27._0_4_ = uVar9;
  auVar27._8_4_ = uVar9;
  auVar27._12_4_ = uVar9;
  auVar27 = vsubps_avx(auVar41,auVar27);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar20._4_4_ = uVar9;
  auVar20._0_4_ = uVar9;
  auVar20._8_4_ = uVar9;
  auVar20._12_4_ = uVar9;
  auVar16 = vsubps_avx(auVar16,auVar20);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar49 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  auVar50 = ZEXT1664(CONCAT412(fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))));
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar51 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
  auVar20 = ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2 + fVar3 * fVar3));
  auVar41 = vshufps_avx(auVar20,auVar20,0);
  auVar20 = vrcpps_avx(auVar41);
  fVar19 = auVar20._0_4_;
  auVar21._0_4_ = fVar19 * auVar41._0_4_;
  fVar24 = auVar20._4_4_;
  auVar21._4_4_ = fVar24 * auVar41._4_4_;
  fVar25 = auVar20._8_4_;
  auVar21._8_4_ = fVar25 * auVar41._8_4_;
  fVar26 = auVar20._12_4_;
  auVar21._12_4_ = fVar26 * auVar41._12_4_;
  auVar41._8_4_ = 0x3f800000;
  auVar41._0_8_ = 0x3f8000003f800000;
  auVar41._12_4_ = 0x3f800000;
  auVar20 = vsubps_avx(auVar41,auVar21);
  fVar19 = fVar19 + fVar19 * auVar20._0_4_;
  fVar24 = fVar24 + fVar24 * auVar20._4_4_;
  fVar25 = fVar25 + fVar25 * auVar20._8_4_;
  fVar26 = fVar26 + fVar26 * auVar20._12_4_;
  auVar28._0_4_ = (fVar1 * auVar43._0_4_ + fVar2 * auVar27._0_4_ + fVar3 * auVar16._0_4_) * fVar19;
  auVar28._4_4_ = (fVar1 * auVar43._4_4_ + fVar2 * auVar27._4_4_ + fVar3 * auVar16._4_4_) * fVar24;
  auVar28._8_4_ = (fVar1 * auVar43._8_4_ + fVar2 * auVar27._8_4_ + fVar3 * auVar16._8_4_) * fVar25;
  auVar28._12_4_ =
       (fVar1 * auVar43._12_4_ + fVar2 * auVar27._12_4_ + fVar3 * auVar16._12_4_) * fVar26;
  auVar42._0_4_ = fVar1 * auVar28._0_4_;
  auVar42._4_4_ = fVar1 * auVar28._4_4_;
  auVar42._8_4_ = fVar1 * auVar28._8_4_;
  auVar42._12_4_ = fVar1 * auVar28._12_4_;
  auVar45._0_4_ = fVar2 * auVar28._0_4_;
  auVar45._4_4_ = fVar2 * auVar28._4_4_;
  auVar45._8_4_ = fVar2 * auVar28._8_4_;
  auVar45._12_4_ = fVar2 * auVar28._12_4_;
  auVar47._0_4_ = fVar3 * auVar28._0_4_;
  auVar47._4_4_ = fVar3 * auVar28._4_4_;
  auVar47._8_4_ = fVar3 * auVar28._8_4_;
  auVar47._12_4_ = fVar3 * auVar28._12_4_;
  auVar41 = vsubps_avx(auVar43,auVar42);
  auVar52 = ZEXT1664(auVar41);
  auVar43 = vsubps_avx(auVar27,auVar45);
  auVar53 = ZEXT1664(auVar43);
  auVar27 = vsubps_avx(auVar16,auVar47);
  auVar48 = ZEXT1664(auVar27);
  auVar34._0_4_ =
       auVar41._0_4_ * auVar41._0_4_ + auVar43._0_4_ * auVar43._0_4_ + auVar27._0_4_ * auVar27._0_4_
  ;
  auVar34._4_4_ =
       auVar41._4_4_ * auVar41._4_4_ + auVar43._4_4_ * auVar43._4_4_ + auVar27._4_4_ * auVar27._4_4_
  ;
  auVar34._8_4_ =
       auVar41._8_4_ * auVar41._8_4_ + auVar43._8_4_ * auVar43._8_4_ + auVar27._8_4_ * auVar27._8_4_
  ;
  auVar34._12_4_ =
       auVar41._12_4_ * auVar41._12_4_ +
       auVar43._12_4_ * auVar43._12_4_ + auVar27._12_4_ * auVar27._12_4_;
  auVar15._0_4_ = auVar29._0_4_ * auVar29._0_4_;
  auVar15._4_4_ = auVar29._4_4_ * auVar29._4_4_;
  auVar15._8_4_ = auVar29._8_4_ * auVar29._8_4_;
  auVar15._12_4_ = auVar29._12_4_ * auVar29._12_4_;
  auVar20 = vcmpps_avx(auVar34,auVar15,2);
  auVar16 = auVar17 & auVar20;
  if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar16[0xf] < '\0') {
    auVar20 = vandps_avx(auVar20,auVar17);
    auVar17 = vsubps_avx(auVar15,auVar34);
    auVar16._0_4_ = fVar19 * auVar17._0_4_;
    auVar16._4_4_ = fVar24 * auVar17._4_4_;
    auVar16._8_4_ = fVar25 * auVar17._8_4_;
    auVar16._12_4_ = fVar26 * auVar17._12_4_;
    auVar15 = vsqrtps_avx(auVar16);
    auVar54 = ZEXT1664(auVar15);
    auVar21 = vsubps_avx(auVar28,auVar15);
    auVar37._0_4_ = auVar15._0_4_ + auVar28._0_4_;
    auVar37._4_4_ = auVar15._4_4_ + auVar28._4_4_;
    auVar37._8_4_ = auVar15._8_4_ + auVar28._8_4_;
    auVar37._12_4_ = auVar15._12_4_ + auVar28._12_4_;
    auVar38 = ZEXT1664(auVar37);
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar29._4_4_ = uVar9;
    auVar29._0_4_ = uVar9;
    auVar29._8_4_ = uVar9;
    auVar29._12_4_ = uVar9;
    auVar17 = vcmpps_avx(auVar29,auVar21,2);
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar39._4_4_ = uVar9;
    auVar39._0_4_ = uVar9;
    auVar39._8_4_ = uVar9;
    auVar39._12_4_ = uVar9;
    auVar40 = ZEXT1664(auVar39);
    auVar16 = vcmpps_avx(auVar21,auVar39,2);
    local_1a8 = vandps_avx(auVar16,auVar17);
    auVar17 = vandps_avx(local_1a8,auVar20);
    auVar16 = vcmpps_avx(auVar29,auVar37,2);
    auVar29 = vcmpps_avx(auVar37,auVar39,2);
    auVar16 = vandps_avx(auVar16,auVar29);
    auVar20 = vandps_avx(auVar16,auVar20);
    auVar35 = ZEXT1664(auVar20);
    local_288 = vorps_avx(auVar17,auVar20);
    if ((((local_288 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (local_288 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (local_288 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        local_288[0xf] < '\0') {
      auVar30._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
      auVar30._8_4_ = -auVar15._8_4_;
      auVar30._12_4_ = -auVar15._12_4_;
      local_1f8 = vblendvps_avx(auVar37,auVar21,auVar17);
      auVar20 = vblendvps_avx(auVar15,auVar30,auVar17);
      fVar19 = auVar20._0_4_;
      auVar22._0_4_ = fVar1 * fVar19;
      fVar24 = auVar20._4_4_;
      auVar22._4_4_ = fVar1 * fVar24;
      fVar25 = auVar20._8_4_;
      auVar22._8_4_ = fVar1 * fVar25;
      fVar26 = auVar20._12_4_;
      auVar22._12_4_ = fVar1 * fVar26;
      auVar31._0_4_ = fVar2 * fVar19;
      auVar31._4_4_ = fVar2 * fVar24;
      auVar31._8_4_ = fVar2 * fVar25;
      auVar31._12_4_ = fVar2 * fVar26;
      auVar17._0_4_ = fVar3 * fVar19;
      auVar17._4_4_ = fVar3 * fVar24;
      auVar17._8_4_ = fVar3 * fVar25;
      auVar17._12_4_ = fVar3 * fVar26;
      local_1e8 = vsubps_avx(auVar22,auVar41);
      local_1d8 = vsubps_avx(auVar31,auVar43);
      local_1c8 = vsubps_avx(auVar17,auVar27);
      auVar43._8_4_ = 0x7f800000;
      auVar43._0_8_ = 0x7f8000007f800000;
      auVar43._12_4_ = 0x7f800000;
      auVar44 = ZEXT1664(auVar43);
      local_118._0_16_ = local_1f8;
      auVar20 = vblendvps_avx(auVar43,local_1f8,local_288);
      auVar17 = vshufps_avx(auVar20,auVar20,0xb1);
      auVar17 = vminps_avx(auVar17,auVar20);
      auVar41 = vshufpd_avx(auVar17,auVar17,1);
      auVar17 = vminps_avx(auVar41,auVar17);
      auVar20 = vcmpps_avx(auVar20,auVar17,0);
      auVar41 = local_288 & auVar20;
      auVar17 = vpcmpeqd_avx(auVar17,auVar17);
      if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar41[0xf] < '\0'
         ) {
        auVar17 = auVar20;
      }
      auVar20 = vandps_avx(local_288,auVar17);
      uVar7 = vmovmskps_avx(auVar20);
      lVar13 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
        }
      }
      pauVar12 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      local_58 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar46 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      do {
        auVar20 = auVar35._0_16_;
        auVar17 = auVar48._0_16_;
        auVar43 = auVar50._0_16_;
        local_238 = &local_e8;
        local_258 = local_278;
        auVar29 = auVar53._0_16_;
        auVar16 = auVar52._0_16_;
        auVar27 = auVar51._0_16_;
        auVar15 = auVar54._0_16_;
        auVar41 = auVar49._0_16_;
        uVar7 = *(uint *)(local_f8 + lVar13 * 4);
        pRVar10 = (RayHitK<4> *)(ulong)uVar7;
        pGVar4 = (pSVar14->geometries).items[(long)pRVar10].ptr;
        local_240 = ray;
        if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_288 + lVar13 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            auVar40 = ZEXT464(*(uint *)(local_1f8 + lVar13 * 4));
            *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_1f8 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1e8 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1d8 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1c8 + lVar13 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
            *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar13];
            *(uint *)(ray + k * 4 + 0x120) = uVar7;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            uVar9 = 0;
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_00dcaef9:
            auVar21 = vshufps_avx(auVar40._0_16_,auVar40._0_16_,0);
            local_1f8 = auVar38._0_16_;
            auVar21 = vcmpps_avx(local_1f8,auVar21,2);
            auVar21 = vandps_avx(auVar21,local_1a8);
            auVar28 = auVar20 & auVar21;
            if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar28[0xf]) {
              return;
            }
            local_288 = vandps_avx(auVar21,auVar20);
            fVar1 = auVar15._0_4_;
            auVar18._0_4_ = auVar41._0_4_ * fVar1;
            fVar2 = auVar15._4_4_;
            auVar18._4_4_ = auVar41._4_4_ * fVar2;
            fVar3 = auVar15._8_4_;
            auVar18._8_4_ = auVar41._8_4_ * fVar3;
            fVar19 = auVar15._12_4_;
            auVar18._12_4_ = auVar41._12_4_ * fVar19;
            auVar23._0_4_ = auVar43._0_4_ * fVar1;
            auVar23._4_4_ = auVar43._4_4_ * fVar2;
            auVar23._8_4_ = auVar43._8_4_ * fVar3;
            auVar23._12_4_ = auVar43._12_4_ * fVar19;
            auVar33._0_4_ = auVar27._0_4_ * fVar1;
            auVar33._4_4_ = auVar27._4_4_ * fVar2;
            auVar33._8_4_ = auVar27._8_4_ * fVar3;
            auVar33._12_4_ = auVar27._12_4_ * fVar19;
            local_1e8 = vsubps_avx(auVar18,auVar16);
            local_1d8 = vsubps_avx(auVar23,auVar29);
            local_1c8 = vsubps_avx(auVar33,auVar17);
            pSVar14 = context->scene;
            auVar20 = vblendvps_avx(auVar44._0_16_,local_1f8,local_288);
            auVar17 = vshufps_avx(auVar20,auVar20,0xb1);
            auVar17 = vminps_avx(auVar17,auVar20);
            auVar41 = vshufpd_avx(auVar17,auVar17,1);
            auVar17 = vminps_avx(auVar41,auVar17);
            auVar17 = vcmpps_avx(auVar20,auVar17,0);
            auVar41 = local_288 & auVar17;
            auVar20 = local_288;
            if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar41[0xf] < '\0') {
              auVar20 = vandps_avx(auVar17,local_288);
            }
            uVar8 = vmovmskps_avx(auVar20);
            lVar13 = 0;
            if (CONCAT44(uVar9,uVar8) != 0) {
              for (; (CONCAT44(uVar9,uVar8) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
              }
            }
            auVar20 = ZEXT816(0) << 0x40;
            auVar48 = ZEXT1664(auVar20);
            auVar6 = vcmpps_avx(ZEXT1632(auVar20),ZEXT1632(auVar20),0xf);
            auVar49 = ZEXT3264(auVar6);
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar20 = vpcmpeqd_avx(auVar27,auVar27);
            auVar51 = ZEXT1664(auVar20);
            do {
              local_238 = &local_e8;
              local_258 = local_278;
              uVar7 = *(uint *)(local_f8 + lVar13 * 4);
              pRVar10 = (RayHitK<4> *)(ulong)uVar7;
              pGVar4 = (pSVar14->geometries).items[(long)pRVar10].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_288 + lVar13 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1f8 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1e8 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1d8 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1c8 + lVar13 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = 0;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(uint *)(ray + k * 4 + 0x110) = (sphere->primIDs).field_0.i[lVar13];
                  *(uint *)(ray + k * 4 + 0x120) = uVar7;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  return;
                }
                local_88 = vpshufd_avx(ZEXT416(uVar7),0);
                local_98 = (sphere->primIDs).field_0.i[lVar13];
                local_e8._0_4_ = *(undefined4 *)(local_1e8 + lVar13 * 4);
                local_d8._4_4_ = *(undefined4 *)(local_1d8 + lVar13 * 4);
                uVar9 = *(undefined4 *)(local_1c8 + lVar13 * 4);
                local_c8._4_4_ = uVar9;
                local_c8._0_4_ = uVar9;
                local_c8._8_4_ = uVar9;
                local_c8._12_4_ = uVar9;
                local_e8._4_4_ = local_e8._0_4_;
                local_e8._8_4_ = local_e8._0_4_;
                local_e8._12_4_ = local_e8._0_4_;
                local_d8._0_4_ = local_d8._4_4_;
                local_d8._8_4_ = local_d8._4_4_;
                local_d8._12_4_ = local_d8._4_4_;
                local_b8 = auVar48._0_32_;
                uStack_94 = local_98;
                uStack_90 = local_98;
                uStack_8c = local_98;
                uStack_74 = context->user->instID[0];
                local_78 = uStack_74;
                uStack_70 = uStack_74;
                uStack_6c = uStack_74;
                uStack_68 = context->user->instPrimID[0];
                uStack_64 = uStack_68;
                uStack_60 = uStack_68;
                uStack_5c = uStack_68;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1f8 + lVar13 * 4);
                local_278 = *pauVar12;
                local_250 = pGVar4->userPtr;
                local_248 = context->user;
                local_230 = 4;
                pRVar10 = (RayHitK<4> *)pGVar4->intersectionFilterN;
                local_208 = auVar38._0_16_;
                local_218 = auVar40._0_16_;
                local_228 = auVar46._0_16_;
                local_1a8._0_8_ = pSVar14;
                local_118 = auVar49._0_32_;
                local_260 = pauVar12;
                local_240 = ray;
                if (pRVar10 != (RayHitK<4> *)0x0) {
                  auVar20 = auVar51._0_16_;
                  pRVar10 = (RayHitK<4> *)(*(code *)pRVar10)(&local_258);
                  auVar20 = vpcmpeqd_avx(auVar20,auVar20);
                  auVar51 = ZEXT1664(auVar20);
                  auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar49 = ZEXT3264(local_118);
                  auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar46 = ZEXT1664(local_228);
                  auVar40 = ZEXT1664(local_218);
                  auVar38 = ZEXT1664(local_208);
                  pSVar14 = (Scene *)local_1a8._0_8_;
                }
                auVar20 = auVar51._0_16_;
                if (local_278 == (undefined1  [16])0x0) {
                  auVar17 = vpcmpeqd_avx(auVar50._0_16_,(undefined1  [16])0x0);
                  auVar20 = auVar20 ^ auVar17;
                  auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  pauVar12 = local_260;
                }
                else {
                  pRVar10 = (RayHitK<4> *)context->args->filter;
                  if ((pRVar10 != (RayHitK<4> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    pRVar10 = (RayHitK<4> *)(*(code *)pRVar10)(&local_258);
                    auVar20 = vpcmpeqd_avx(auVar20,auVar20);
                    auVar51 = ZEXT1664(auVar20);
                    auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar49 = ZEXT3264(local_118);
                    auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar46 = ZEXT1664(local_228);
                    auVar40 = ZEXT1664(local_218);
                    auVar38 = ZEXT1664(local_208);
                    pSVar14 = (Scene *)local_1a8._0_8_;
                  }
                  auVar17 = vpcmpeqd_avx(auVar50._0_16_,local_278);
                  auVar20 = auVar51._0_16_ ^ auVar17;
                  auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                  pauVar12 = local_260;
                  if (local_278 != (undefined1  [16])0x0) {
                    auVar17 = auVar51._0_16_ ^ auVar17;
                    auVar41 = vmaskmovps_avx(auVar17,*local_238);
                    *(undefined1 (*) [16])(local_240 + 0xc0) = auVar41;
                    auVar41 = vmaskmovps_avx(auVar17,local_238[1]);
                    *(undefined1 (*) [16])(local_240 + 0xd0) = auVar41;
                    auVar41 = vmaskmovps_avx(auVar17,local_238[2]);
                    *(undefined1 (*) [16])(local_240 + 0xe0) = auVar41;
                    auVar41 = vmaskmovps_avx(auVar17,local_238[3]);
                    *(undefined1 (*) [16])(local_240 + 0xf0) = auVar41;
                    auVar41 = vmaskmovps_avx(auVar17,local_238[4]);
                    *(undefined1 (*) [16])(local_240 + 0x100) = auVar41;
                    auVar41 = vmaskmovps_avx(auVar17,local_238[5]);
                    *(undefined1 (*) [16])(local_240 + 0x110) = auVar41;
                    auVar41 = vmaskmovps_avx(auVar17,local_238[6]);
                    *(undefined1 (*) [16])(local_240 + 0x120) = auVar41;
                    auVar41 = vmaskmovps_avx(auVar17,local_238[7]);
                    *(undefined1 (*) [16])(local_240 + 0x130) = auVar41;
                    auVar17 = vmaskmovps_avx(auVar17,local_238[8]);
                    *(undefined1 (*) [16])(local_240 + 0x140) = auVar17;
                    pRVar10 = local_240;
                  }
                }
                if ((auVar46._0_16_ & auVar20) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = auVar40._0_4_;
                }
                else {
                  auVar40 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_288 + lVar13 * 4) = 0;
                auVar20 = vshufps_avx(auVar40._0_16_,auVar40._0_16_,0);
                auVar20 = vcmpps_avx(auVar38._0_16_,auVar20,2);
                local_288 = vandps_avx(auVar20,local_288);
              }
              if ((((local_288 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_288 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_288 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_288[0xf]) {
                return;
              }
              auVar20 = vblendvps_avx(auVar44._0_16_,auVar38._0_16_,local_288);
              auVar17 = vshufps_avx(auVar20,auVar20,0xb1);
              auVar17 = vminps_avx(auVar17,auVar20);
              auVar41 = vshufpd_avx(auVar17,auVar17,1);
              auVar17 = vminps_avx(auVar41,auVar17);
              auVar17 = vcmpps_avx(auVar20,auVar17,0);
              auVar41 = local_288 & auVar17;
              auVar20 = local_288;
              if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar41[0xf] < '\0') {
                auVar20 = vandps_avx(auVar17,local_288);
              }
              uVar9 = vmovmskps_avx(auVar20);
              uVar11 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar9);
              lVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
            } while( true );
          }
          local_198 = auVar20;
          local_88 = vpshufd_avx(ZEXT416(uVar7),0);
          local_98 = (sphere->primIDs).field_0.i[lVar13];
          local_e8._0_4_ = *(undefined4 *)(local_1e8 + lVar13 * 4);
          uVar9 = *(undefined4 *)(local_1d8 + lVar13 * 4);
          auVar32._4_4_ = uVar9;
          auVar32._0_4_ = uVar9;
          auVar32._8_4_ = uVar9;
          auVar32._12_4_ = uVar9;
          local_c8._4_4_ = *(undefined4 *)(local_1c8 + lVar13 * 4);
          local_e8._4_4_ = local_e8._0_4_;
          local_e8._8_4_ = local_e8._0_4_;
          local_e8._12_4_ = local_e8._0_4_;
          local_d8 = auVar32;
          local_c8._0_4_ = local_c8._4_4_;
          local_c8._8_4_ = local_c8._4_4_;
          local_c8._12_4_ = local_c8._4_4_;
          local_b8 = ZEXT432(0) << 0x20;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_74 = context->user->instID[0];
          local_78 = uStack_74;
          uStack_70 = uStack_74;
          uStack_6c = uStack_74;
          uStack_68 = context->user->instPrimID[0];
          uStack_64 = uStack_68;
          uStack_60 = uStack_68;
          uStack_5c = uStack_68;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1f8 + lVar13 * 4);
          local_278 = *pauVar12;
          local_250 = pGVar4->userPtr;
          local_248 = context->user;
          local_230 = 4;
          pRVar10 = (RayHitK<4> *)pGVar4->intersectionFilterN;
          local_208 = auVar38._0_16_;
          local_218 = auVar40._0_16_;
          local_228 = auVar46._0_16_;
          local_1b0 = pSVar14;
          local_128 = auVar41;
          local_138 = auVar43;
          local_148 = auVar27;
          local_158 = auVar16;
          local_168 = auVar29;
          local_178 = auVar17;
          local_188 = auVar15;
          if (pRVar10 != (RayHitK<4> *)0x0) {
            local_260 = pauVar12;
            pRVar10 = (RayHitK<4> *)(*(code *)pRVar10)(&local_258);
            auVar54 = ZEXT1664(local_188);
            auVar48 = ZEXT1664(local_178);
            auVar53 = ZEXT1664(local_168);
            auVar52 = ZEXT1664(local_158);
            auVar51 = ZEXT1664(local_148);
            auVar50 = ZEXT1664(local_138);
            auVar49 = ZEXT1664(local_128);
            auVar46 = ZEXT1664(local_228);
            auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar40 = ZEXT1664(local_218);
            auVar38 = ZEXT1664(local_208);
            pauVar12 = local_260;
          }
          if (local_278 == (undefined1  [16])0x0) {
            auVar20 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar20 = auVar20 ^ _DAT_01f7ae20;
            auVar35 = ZEXT1664(local_198);
          }
          else {
            pRVar10 = (RayHitK<4> *)context->args->filter;
            auVar35 = ZEXT1664(local_198);
            if ((pRVar10 != (RayHitK<4> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              pRVar10 = (RayHitK<4> *)(*(code *)pRVar10)(&local_258);
              auVar35 = ZEXT1664(local_198);
              auVar54 = ZEXT1664(local_188);
              auVar48 = ZEXT1664(local_178);
              auVar53 = ZEXT1664(local_168);
              auVar52 = ZEXT1664(local_158);
              auVar51 = ZEXT1664(local_148);
              auVar50 = ZEXT1664(local_138);
              auVar49 = ZEXT1664(local_128);
              auVar46 = ZEXT1664(local_228);
              auVar44 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar40 = ZEXT1664(local_218);
              auVar38 = ZEXT1664(local_208);
            }
            auVar17 = vpcmpeqd_avx(local_278,_DAT_01f7aa10);
            auVar41 = vpcmpeqd_avx(auVar32,auVar32);
            auVar20 = auVar17 ^ auVar41;
            if (local_278 != (undefined1  [16])0x0) {
              auVar17 = auVar17 ^ auVar41;
              auVar41 = vmaskmovps_avx(auVar17,*local_238);
              *(undefined1 (*) [16])(local_240 + 0xc0) = auVar41;
              auVar41 = vmaskmovps_avx(auVar17,local_238[1]);
              *(undefined1 (*) [16])(local_240 + 0xd0) = auVar41;
              auVar41 = vmaskmovps_avx(auVar17,local_238[2]);
              *(undefined1 (*) [16])(local_240 + 0xe0) = auVar41;
              auVar41 = vmaskmovps_avx(auVar17,local_238[3]);
              *(undefined1 (*) [16])(local_240 + 0xf0) = auVar41;
              auVar41 = vmaskmovps_avx(auVar17,local_238[4]);
              *(undefined1 (*) [16])(local_240 + 0x100) = auVar41;
              auVar41 = vmaskmovps_avx(auVar17,local_238[5]);
              *(undefined1 (*) [16])(local_240 + 0x110) = auVar41;
              auVar41 = vmaskmovps_avx(auVar17,local_238[6]);
              *(undefined1 (*) [16])(local_240 + 0x120) = auVar41;
              auVar41 = vmaskmovps_avx(auVar17,local_238[7]);
              *(undefined1 (*) [16])(local_240 + 0x130) = auVar41;
              auVar17 = vmaskmovps_avx(auVar17,local_238[8]);
              *(undefined1 (*) [16])(local_240 + 0x140) = auVar17;
              pRVar10 = local_240;
            }
          }
          pSVar14 = local_1b0;
          if ((auVar46._0_16_ & auVar20) == (undefined1  [16])0x0) {
            *(int *)(ray + k * 4 + 0x80) = auVar40._0_4_;
          }
          else {
            auVar40 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
          }
          *(undefined4 *)(local_288 + lVar13 * 4) = 0;
          auVar20 = vshufps_avx(auVar40._0_16_,auVar40._0_16_,0);
          auVar20 = vcmpps_avx(local_118._0_16_,auVar20,2);
          local_288 = vandps_avx(auVar20,local_288);
        }
        uVar9 = (undefined4)((ulong)pRVar10 >> 0x20);
        auVar20 = auVar35._0_16_;
        auVar17 = auVar48._0_16_;
        auVar43 = auVar50._0_16_;
        auVar29 = auVar53._0_16_;
        auVar16 = auVar52._0_16_;
        auVar27 = auVar51._0_16_;
        auVar15 = auVar54._0_16_;
        auVar41 = auVar49._0_16_;
        if ((((local_288 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_288 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_288 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_288[0xf]) goto LAB_00dcaef9;
        auVar20 = vblendvps_avx(auVar44._0_16_,local_118._0_16_,local_288);
        auVar17 = vshufps_avx(auVar20,auVar20,0xb1);
        auVar17 = vminps_avx(auVar17,auVar20);
        auVar41 = vshufpd_avx(auVar17,auVar17,1);
        auVar17 = vminps_avx(auVar41,auVar17);
        auVar17 = vcmpps_avx(auVar20,auVar17,0);
        auVar41 = local_288 & auVar17;
        auVar20 = local_288;
        if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar41[0xf] < '\0') {
          auVar20 = vandps_avx(auVar17,local_288);
        }
        uVar8 = vmovmskps_avx(auVar20);
        lVar13 = 0;
        if (CONCAT44(uVar9,uVar8) != 0) {
          for (; (CONCAT44(uVar9,uVar8) >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Intersect1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }